

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>::
find<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Entry,kj::PathPtr&>
          (HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>
           *this,ArrayPtr<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry>
                 table,PathPtr *params)

{
  undefined8 *puVar1;
  size_t sVar2;
  String *pSVar3;
  uchar *puVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar8;
  uchar *puVar9;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar10;
  uint uVar11;
  ulong uVar12;
  Disposer *pDVar13;
  Entry *pEVar14;
  uchar *puVar15;
  ArrayPtr<const_kj::String> *in_R8;
  long lVar16;
  ArrayDisposer *pAVar17;
  ArrayPtr<const_unsigned_char> s;
  Maybe<unsigned_long> MVar18;
  PathPtr local_40;
  
  aVar8.value = table.size_;
  pEVar14 = table.ptr;
  aVar10.value = aVar8.value;
  if ((pEVar14->value).dir.disposer != (Disposer *)0x0) {
    sVar2 = in_R8->size_;
    uVar11 = (int)sVar2 * 4;
    if (sVar2 != 0) {
      pSVar3 = in_R8->ptr;
      lVar16 = 0;
      do {
        puVar4 = *(uchar **)((long)&(pSVar3->content).size_ + lVar16);
        puVar15 = puVar4;
        if (puVar4 != (uchar *)0x0) {
          puVar15 = *(uchar **)((long)&(pSVar3->content).ptr + lVar16);
        }
        puVar9 = (uchar *)0x0;
        if (puVar4 != (uchar *)0x0) {
          puVar9 = puVar4 + -1;
        }
        s.size_ = (size_t)puVar9;
        s.ptr = puVar15;
        uVar6 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s);
        uVar11 = uVar11 * 0x5bd1e995 ^
                 (uVar6 * 0x5bd1e995 >> 0x18 ^ uVar6 * 0x5bd1e995) * 0x5bd1e995;
        lVar16 = lVar16 + 0x18;
        aVar10 = extraout_RDX;
      } while (sVar2 * 0x18 != lVar16);
    }
    uVar11 = (uVar11 >> 0xd ^ uVar11) * 0x5bd1e995;
    uVar11 = uVar11 >> 0xf ^ uVar11;
    uVar12 = (ulong)(*(int *)&(pEVar14->value).dir.disposer - 1U & uVar11);
    pAVar17 = (pEVar14->key).parts.disposer;
    iVar7 = *(int *)((long)&pAVar17[uVar12]._vptr_ArrayDisposer + 4);
    if (iVar7 != 0) {
      pAVar17 = pAVar17 + uVar12;
      do {
        if ((iVar7 != 1) && (*(uint *)&pAVar17->_vptr_ArrayDisposer == uVar11)) {
          puVar1 = (undefined8 *)(aVar8.value + (ulong)(iVar7 - 2) * 0x30);
          local_40.parts.ptr = (String *)*puVar1;
          local_40.parts.size_ = puVar1[1];
          bVar5 = PathPtr::operator==(&local_40,(PathPtr)*in_R8);
          aVar10 = extraout_RDX_00;
          if (bVar5) {
            iVar7 = *(int *)((long)&pAVar17->_vptr_ArrayDisposer + 4);
            *this = (HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>
                     )0x1;
            *(ulong *)(this + 8) = (ulong)(iVar7 - 2);
            goto LAB_0011ac5e;
          }
        }
        pDVar13 = (Disposer *)(uVar12 + 1);
        uVar12 = (ulong)pDVar13 & 0xffffffff;
        if (pDVar13 == (pEVar14->value).dir.disposer) {
          uVar12 = 0;
        }
        pAVar17 = (pEVar14->key).parts.disposer + uVar12;
        iVar7 = *(int *)((long)&pAVar17->_vptr_ArrayDisposer + 4);
      } while (iVar7 != 0);
    }
  }
  *this = (HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>
           )0x0;
LAB_0011ac5e:
  MVar18.ptr.field_1.value = aVar10.value;
  MVar18.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar18.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }